

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O3

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::
do_push<true>(queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *this
             ,Task **t)

{
  uint uVar1;
  tagged_index tVar2;
  uint uVar3;
  tagged_index tVar4;
  node *pnVar5;
  uint uVar6;
  uint *puVar7;
  long lVar8;
  unsigned_short local_a;
  
  local_a = (unsigned_short)
            (this->pool).
            super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
            .node_count_;
  pnVar5 = detail::
           fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>>
           ::construct<true,true,depspawn::internal::TaskPool::Task*,unsigned_short>
                     ((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>>
                       *)&this->pool,t,&local_a);
  if (pnVar5 != (node *)0x0) {
    uVar6 = (uint)((int)pnVar5 -
                  *(int *)&(this->pool).
                           super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                           .nodes_) >> 6 & 0xffff;
    do {
      while( true ) {
        do {
          tVar2 = (this->tail_)._M_i;
          puVar7 = (uint *)((long)&(((this->pool).
                                     super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                                    .nodes_)->next)._M_i.index +
                           (ulong)(((uint)tVar2 & 0xffff) << 6));
          if (tVar2.index ==
              (index_t)(this->pool).
                       super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                       .node_count_) {
            puVar7 = (uint *)0x0;
          }
          uVar3 = *puVar7;
          lVar8 = 0;
          if ((short)uVar3 !=
              (short)(this->pool).
                     super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                     .node_count_) {
            lVar8 = (long)&(((this->pool).
                             super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                            .nodes_)->next)._M_i.index + (ulong)((uVar3 & 0xffff) << 6);
          }
          tVar4 = (this->tail_)._M_i;
        } while ((tVar2.index != tVar4.index) || (0xffff < ((uint)tVar4 ^ (uint)tVar2)));
        if (lVar8 == 0) break;
        LOCK();
        if (tVar2 == (this->tail_)._M_i) {
          (this->tail_)._M_i =
               (tagged_index)
               (((uint)((int)lVar8 -
                       *(int *)&(this->pool).
                                super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                                .nodes_) >> 6 & 0xffff) + ((uint)tVar2 & 0xffff0000) + 0x10000);
        }
        UNLOCK();
      }
      LOCK();
      uVar1 = *puVar7;
      if (uVar3 == uVar1) {
        *puVar7 = (uVar3 & 0xffff0000) + uVar6 + 0x10000;
      }
      UNLOCK();
    } while (uVar3 != uVar1);
    LOCK();
    if (tVar2 == (this->tail_)._M_i) {
      (this->tail_)._M_i = (tagged_index)(uVar6 + ((uint)tVar2 & 0xffff0000) + 0x10000);
    }
    UNLOCK();
  }
  return pnVar5 != (node *)0x0;
}

Assistant:

bool do_push(T const & t)
    {
        node * n = pool.template construct<true, Bounded>(t, pool.null_handle());
        handle_type node_handle = pool.get_handle(n);

        if (n == NULL)
            return false;

        for (;;) {
            tagged_node_handle tail = tail_.load(memory_order_acquire);
            node * tail_node = pool.get_pointer(tail);
            tagged_node_handle next = tail_node->next.load(memory_order_acquire);
            node * next_ptr = pool.get_pointer(next);

            tagged_node_handle tail2 = tail_.load(memory_order_acquire);
            if (BOOST_LIKELY(tail == tail2)) {
                if (next_ptr == 0) {
                    tagged_node_handle new_tail_next(node_handle, next.get_next_tag());
                    if ( tail_node->next.compare_exchange_weak(next, new_tail_next) ) {
                        tagged_node_handle new_tail(node_handle, tail.get_next_tag());
                        tail_.compare_exchange_strong(tail, new_tail);
                        return true;
                    }
                }
                else {
                    tagged_node_handle new_tail(pool.get_handle(next_ptr), tail.get_next_tag());
                    tail_.compare_exchange_strong(tail, new_tail);
                }
            }
        }
    }